

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O3

void api_suite::api_push_front_iterator(void)

{
  pointer piVar1;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> input;
  circular_array<int,_4UL> data;
  undefined4 local_6c;
  size_type local_68;
  vector<int,_std::allocator<int>_> local_60;
  type local_48 [4];
  circular_view<int,_4UL> local_38;
  
  local_38.member.data = local_48;
  local_38.member.size = 0;
  local_38.member.next = 4;
  local_68 = 0x160000000b;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,(allocator_type *)&local_6c);
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar1 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      vista::circular_view<int,_4UL>::push_front(&local_38,*piVar1);
      piVar1 = piVar1 + 1;
    } while (piVar1 != local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  local_68 = local_38.member.size;
  local_6c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0xba,"void api_suite::api_push_front_iterator()",&local_68,(allocator_type *)&local_6c
            );
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (value_type *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void api_push_front_iterator()
{
    circular_array<int, 4> data;
    std::vector<int> input = { 11, 22 };
    data.push_front(input.begin(), input.end());
    BOOST_TEST_EQ(data.size(), 2);
}